

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O3

objc_slot2 * objc_get_slot2(Class cls,SEL selector,uint64_t *version)

{
  uint *puVar1;
  objc_slot2 *poVar2;
  
  if (version != (uint64_t *)0x0) {
    *version = objc_method_cache_version;
  }
  puVar1 = (uint *)cls->dtable;
  poVar2 = (objc_slot2 *)
           (*(code *)(&DAT_00120ba0 +
                     *(int *)(&DAT_00120ba0 + (ulong)(*puVar1 << 0x1d | *puVar1 >> 3) * 4)))
                     (&DAT_00120ba0 +
                      *(int *)(&DAT_00120ba0 + (ulong)(*puVar1 << 0x1d | *puVar1 >> 3) * 4),puVar1,
                      puVar1,puVar1);
  return poVar2;
}

Assistant:

struct objc_slot2 *objc_get_slot2(Class cls, SEL selector, uint64_t *version)
{
#ifndef NO_SAFE_CACHING
	if (version)
	{
		*version = objc_method_cache_version;
	}
#endif
	struct objc_slot2 * result = objc_dtable_lookup(cls->dtable, selector->index);
	if (0 == result)
	{
		void *dtable = dtable_for_class(cls);
		/* Install the dtable if it hasn't already been initialized. */
		if (dtable == uninstalled_dtable)
		{
			dtable = dtable_for_class(cls);
			result = objc_dtable_lookup(dtable, selector->index);
		}
		else
		{
			// Check again incase another thread updated the dtable while we
			// weren't looking
			result = objc_dtable_lookup(dtable, selector->index);
		}
		if (NULL == result)
		{
			if ((result = objc_dtable_lookup(dtable, get_untyped_idx(selector))))
			{
#ifndef NO_SAFE_CACHING
				if (version)
				{
					*version = 0;
				}
#endif
				uncacheable_slot.imp = call_mismatch_hook(cls, selector, result);
				result = (struct objc_slot2*)&uncacheable_slot;
			}
		}
	}
	return result;
}